

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestTemplateString(void)

{
  char cVar1;
  long lVar2;
  allocator local_fa;
  allocator local_f9;
  undefined1 local_f8 [32];
  TemplateString local_d8;
  TemplateCache cache;
  TemplateDictionary dict;
  
  ctemplate::TemplateCache::TemplateCache(&cache);
  _dict = kKey.do_not_use_directly_.ptr_;
  local_f8._0_8_ = kContent.do_not_use_directly_.ptr_;
  local_f8._8_8_ = kContent.do_not_use_directly_.length_;
  local_f8[0x10] = true;
  local_f8._24_8_ = kContent.do_not_use_directly_.id_;
  cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)local_f8);
  if (cVar1 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x3b3,
           "cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)");
    _dict = kKey.do_not_use_directly_.ptr_;
    local_f8._0_8_ = kContent.do_not_use_directly_.ptr_;
    local_f8._8_8_ = kContent.do_not_use_directly_.length_;
    local_f8[0x10] = true;
    local_f8._24_8_ = kContent.do_not_use_directly_.id_;
    cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)local_f8);
    if (cVar1 == '\0') {
      __assert_fail("cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3b3,"static void TemplateCacheUnittest::TestTemplateString()");
    }
  }
  else {
    _dict = kKey.do_not_use_directly_.ptr_;
    lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&dict);
    if (lVar2 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3b5,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3b5,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary
              (&dict,(TemplateString *)local_f8,(UnsafeArena *)0x0);
    std::__cxx11::string::string((string *)local_f8,"MY_KEY",&local_f9);
    std::__cxx11::string::string((string *)&local_d8,"content",&local_fa);
    ctemplate::AssertExpandWithCacheIs
              (&cache,(string *)local_f8,DO_NOT_STRIP,&dict,(PerExpandData *)0x0,(string *)&local_d8
               ,true);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_f8);
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
    lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)local_f8);
    if (lVar2 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3bd,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3bd,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    std::__cxx11::string::string((string *)local_f8,"MY_KEY",&local_f9);
    std::__cxx11::string::string((string *)&local_d8,"content",&local_fa);
    ctemplate::AssertExpandWithCacheIs
              (&cache,(string *)local_f8,DO_NOT_STRIP,&dict,(PerExpandData *)0x0,(string *)&local_d8
               ,true);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_f8);
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
    ctemplate::TemplateCache::Delete((TemplateString *)&cache);
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
    lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)local_f8);
    if (lVar2 != 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x3c4,"!tpl");
      __assert_fail("!tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c4,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
    ctemplate::TemplateString::TemplateString(&local_d8,"content");
    cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)local_f8,(Strip)&local_d8);
    if (cVar1 != '\0') {
      local_f8._0_8_ = kKey.do_not_use_directly_.ptr_;
      local_f8._8_8_ = kKey.do_not_use_directly_.length_;
      local_f8[0x10] = true;
      local_f8._24_8_ = kKey.do_not_use_directly_.id_;
      lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)local_f8);
      if (lVar2 == 0) {
        printf("ASSERT FAILED, line %d: %s\n",0x3c8,"tpl");
        __assert_fail("tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x3c8,"static void TemplateCacheUnittest::TestTemplateString()");
      }
      local_f8._0_8_ = kKey.do_not_use_directly_.ptr_;
      local_f8._8_8_ = kKey.do_not_use_directly_.length_;
      local_f8[0x10] = true;
      local_f8._24_8_ = kKey.do_not_use_directly_.id_;
      ctemplate::TemplateCache::Delete((TemplateString *)&cache);
      ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
      lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)local_f8);
      if (lVar2 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        ctemplate::TemplateCache::~TemplateCache(&cache);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x3cb,"!tpl");
      __assert_fail("!tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3cb,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    printf("ASSERT FAILED, line %d: %s\n",0x3c6,
           "cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString((TemplateString *)local_f8,"MY_KEY");
    ctemplate::TemplateString::TemplateString(&local_d8,"content");
    cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)local_f8,(Strip)&local_d8);
    if (cVar1 == '\0') {
      __assert_fail("cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c6,"static void TemplateCacheUnittest::TestTemplateString()");
    }
  }
  exit(1);
}

Assistant:

static void TestTemplateString() {
    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP));
    const Template *tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);

    TemplateDictionary dict("dict");
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Try retrieving with a char* rather than a TemplateString*.
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(tpl);
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Delete with a char* rather than a TemplateString*.
    cache.Delete("MY_KEY");
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);

    ASSERT(cache.StringToTemplateCache("MY_KEY", "content", DO_NOT_STRIP));
    tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);
    cache.Delete(kKey);
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);
  }